

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O2

chunk_conflict * river_gen(player *p,wchar_t height,wchar_t width,char **p_error)

{
  _Bool _Var1;
  wchar_t wVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  chunk *c;
  feature *pfVar8;
  void *p_00;
  char **ppcVar9;
  wchar_t *pwVar10;
  loc_conflict lVar11;
  int iVar12;
  wchar_t wVar13;
  long lVar14;
  loc grid;
  wchar_t wVar15;
  loc grid_00;
  long lVar16;
  uint uVar17;
  loc grid_01;
  wchar_t wVar18;
  long lVar19;
  loc lVar20;
  loc lVar21;
  loc grid_02;
  wchar_t form_feats [7];
  
  wVar15 = (wchar_t)p->place;
  wVar2 = (wchar_t)p->last_place;
  form_feats[0] = FEAT_TREE;
  form_feats[1] = FEAT_PASS_RUBBLE;
  form_feats[2] = FEAT_MAGMA;
  form_feats[3] = FEAT_GRANITE;
  form_feats[4] = FEAT_TREE2;
  form_feats[5] = FEAT_QUARTZ;
  form_feats[6] = FEAT_NONE;
  ppcVar9 = p_error;
  c = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  c->depth = (int)p->depth;
  c->place = wVar15;
  wVar6 = c->height;
  lVar14 = 0;
  wVar18 = wVar6;
  for (lVar19 = 0; lVar19 < wVar18; lVar19 = lVar19 + 1) {
    for (lVar16 = 0; lVar16 < c->width; lVar16 = lVar16 + 1) {
      square_set_feat((chunk_conflict *)c,(loc)(lVar14 + lVar16),FEAT_GRASS);
    }
    wVar18 = c->height;
    lVar14 = lVar14 + 0x100000000;
  }
  alloc_paths((chunk_conflict *)c,(player *)(ulong)(uint)wVar15,wVar2,(wchar_t)ppcVar9);
  lVar20.x = (p->grid).x;
  lVar20.y = (p->grid).y;
  pfVar8 = square_feat((chunk_conflict *)c,lVar20);
  wVar18 = pfVar8->fidx;
  set_num_vaults((chunk_conflict *)c);
  make_edges((chunk_conflict *)c,true,false);
  uVar3 = c->width / 3;
  uVar4 = Rand_div(uVar3);
  iVar12 = uVar4 + uVar3;
  p_00 = mem_zalloc((long)c->height << 2);
  for (lVar14 = 1; lVar14 < (long)c->height + -1; lVar14 = lVar14 + 1) {
    *(int *)((long)p_00 + lVar14 * 4) = iVar12;
    uVar3 = Rand_div(5);
    uVar17 = (iVar12 - uVar3) - 10;
    while( true ) {
      uVar3 = Rand_div(5);
      if ((int)(uVar3 + iVar12 + 10) <= (int)uVar17) break;
      lVar20 = (loc)((ulong)uVar17 | lVar14 << 0x20);
      square_set_feat((chunk_conflict *)c,lVar20,FEAT_WATER);
      square_mark((chunk_conflict *)c,lVar20);
      uVar17 = uVar17 + 1;
    }
    uVar3 = Rand_div(3);
    iVar12 = iVar12 + uVar3 + -1;
  }
  iVar12 = wVar6 / 2;
  lVar14 = (long)iVar12;
  lVar20 = (loc)loc(*(int *)((long)p_00 + lVar14 * 4),iVar12);
  if (world->levels[wVar15].down != (char *)0x0) {
    num_wild_vaults = L'\0';
    if (world->levels[wVar15].locality == LOC_SIRION_VALE) {
      for (lVar19 = lVar14 + -10; lVar19 != iVar12 + 10; lVar19 = lVar19 + 1) {
        iVar5 = *(int *)((long)p_00 + lVar19 * 4);
        for (uVar17 = iVar5 - 10; (int)uVar17 < iVar5 + 10; uVar17 = uVar17 + 1) {
          lVar21 = (loc)((ulong)uVar17 | lVar19 << 0x20);
          wVar6 = distance((loc_conflict)lVar20,(loc_conflict)lVar21);
          pwVar10 = &FEAT_WATER;
          if (wVar6 < L'\x06') {
            pwVar10 = &FEAT_GRASS;
          }
          square_set_feat((chunk_conflict *)c,lVar21,*pwVar10);
          wVar6 = distance((loc_conflict)lVar20,(loc_conflict)lVar21);
          if (wVar6 < L'\x02') {
            square_set_feat((chunk_conflict *)c,lVar21,FEAT_GRANITE);
          }
          iVar5 = *(int *)((long)p_00 + lVar19 * 4);
        }
      }
      lVar21 = (loc)loc(*(int *)((long)p_00 + lVar14 * 4),iVar12 + 1);
      square_set_feat((chunk_conflict *)c,lVar21,FEAT_CLOSED);
      square_set_feat((chunk_conflict *)c,lVar20,FEAT_MORE);
      wVar6 = level_topography(wVar2);
      if (wVar6 == L'\a') {
        player_place((chunk_conflict2 *)c,p,lVar20);
      }
    }
    else {
      lVar11 = loc(*(int *)((long)p_00 + lVar14 * 4) + -6,iVar12);
      for (wVar6 = iVar12 + L'\xffffffff'; wVar6 != iVar12 + L'\x02'; wVar6 = wVar6 + L'\x01') {
        wVar7 = *(wchar_t *)((long)p_00 + lVar14 * 4);
        for (wVar15 = wVar7 + L'\xfffffff1'; wVar13 = wVar7 + L'\xfffffffb', wVar15 < wVar13;
            wVar15 = wVar15 + L'\x01') {
          grid_02.y = wVar6;
          grid_02.x = wVar15;
          _Var1 = loc_eq((loc_conflict)grid_02,lVar11);
          if (_Var1) {
            square_set_feat((chunk_conflict *)c,grid_02,FEAT_MORE);
            wVar7 = level_topography(wVar2);
            if (wVar7 == L'\a') {
              player_place((chunk_conflict2 *)c,p,grid_02);
            }
          }
          else {
            square_set_feat((chunk_conflict *)c,grid_02,FEAT_GRANITE);
          }
          wVar7 = *(wchar_t *)((long)p_00 + lVar14 * 4);
        }
        for (; wVar13 < wVar7; wVar13 = wVar13 + L'\x01') {
          lVar21.y = wVar6;
          lVar21.x = wVar13;
          square_set_feat((chunk_conflict *)c,lVar21,FEAT_ROAD);
          wVar7 = *(wchar_t *)((long)p_00 + lVar14 * 4);
        }
        for (wVar15 = wVar7 + L'\xfffffffc'; wVar15 < wVar7 + L'\x05'; wVar15 = wVar15 + L'\x01') {
          grid_00.y = wVar6;
          grid_00.x = wVar15;
          square_set_feat((chunk_conflict *)c,grid_00,FEAT_WATER);
          wVar7 = *(wchar_t *)((long)p_00 + lVar14 * 4);
        }
      }
    }
  }
  for (iVar12 = 0; iVar12 < c->depth * 0x32 + 1000; iVar12 = iVar12 + wVar6) {
    uVar3 = Rand_div(c->height + L'\xfffffffe');
    uVar4 = Rand_div(c->width + L'\xfffffffe');
    lVar11.x = uVar4 + 1;
    lVar11.y = uVar3 + 1;
    wVar6 = make_formation((chunk_conflict *)c,p,lVar11,FEAT_GRASS,FEAT_GRASS,form_feats,"River",
                           c->depth / 2);
  }
  lVar14 = 0;
  for (lVar19 = 0; lVar19 < c->height; lVar19 = lVar19 + 1) {
    for (lVar16 = 0; lVar16 < c->width; lVar16 = lVar16 + 1) {
      square_unmark((chunk_conflict *)c,(loc)(lVar14 + lVar16));
    }
    lVar14 = lVar14 + 0x100000000;
  }
  wVar6 = (p->grid).x;
  wVar2 = (p->grid).y;
  do {
    grid_01.y = wVar2;
    grid_01.x = wVar6;
    pfVar8 = square_feat((chunk_conflict *)c,grid_01);
    if (pfVar8->fidx != FEAT_WATER) {
      pfVar8 = square_feat((chunk_conflict *)c,grid_01);
      if (pfVar8->fidx != FEAT_GRANITE) {
        _Var1 = loc_eq((loc_conflict)grid_01,p->grid);
        if (!_Var1) {
          player_place((chunk_conflict2 *)c,p,grid_01);
          square_set_feat((chunk_conflict *)c,grid_01,wVar18);
          wVar18 = (p->grid).y;
          grid.y = wVar18;
          grid.x = wVar6;
          for (; L'\0' < wVar18; wVar18 = wVar18 + L'\xffffffff') {
            _Var1 = square_ispassable((chunk_conflict *)c,grid);
            if (!_Var1) {
              square_set_feat((chunk_conflict *)c,grid,FEAT_ROAD);
            }
            grid = (loc)((long)grid + -0x100000000);
          }
        }
        populate((chunk_conflict *)c,false);
        mem_free(p_00);
        _Var1 = verify_level((chunk_conflict *)c);
        if (!_Var1) {
          wipe_mon_list(c,p);
          cave_free((chunk_conflict *)c);
          *p_error = "wilderness level had generation issues";
          c = (chunk *)0x0;
        }
        return (chunk_conflict *)c;
      }
    }
    wVar6 = wVar6 + L'\x01';
  } while( true );
}

Assistant:

struct chunk *river_gen(struct player *p, int height, int width,
						const char **p_error)
{
	struct loc grid, centre;
	int i, y1;
	int *mid;
	int place = p->place;
	int last_place = p->last_place;
	int form_grids = 0;
	int path;

	int form_feats[] = { FEAT_TREE, FEAT_PASS_RUBBLE, FEAT_MAGMA, FEAT_GRANITE,
						 FEAT_TREE2, FEAT_QUARTZ, FEAT_NONE };

    /* Make the level */
    struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = place;
	y1 = c->height / 2;

	/* Start with grass */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create grass */
			square_set_feat(c, grid, FEAT_GRASS);
		}
	}

	/* Place 2 or 3 paths to neighbouring places, place player -NRM- */
	alloc_paths(c, p, place, last_place);

	/* Remember the path in case it has to move */
	path = square_feat(c, p->grid)->fidx;

	/* Set the number of wilderness vaults */
	set_num_vaults(c);

	/* Make place boundaries */
	make_edges(c, true, false);

	/* Place the river, start in the middle third */
	i = c->width / 3 + randint0(c->width / 3);
	mid = mem_zalloc(c->height * sizeof(int));
	for (grid.y = 1; grid.y < c->height - 1; grid.y++) {
		/* Remember the midpoint */
		mid[grid.y] = i;

		for (grid.x = i - randint0(5) - 10; grid.x < i + randint0(5) + 10;
			 grid.x++) {
			/* Make the river */
			square_set_feat(c, grid, FEAT_WATER);
			square_mark(c, grid);
		}
		/* Meander */
		i += randint0(3) - 1;
	}

	/* Mark the centre */
	centre = loc(mid[y1], y1);

	/* Special dungeon entrances */
	if (world->levels[place].down) {
		/* No vaults */
		num_wild_vaults = 0;

		/* If we're at Sauron's Isle... */
		if (world->levels[place].locality == LOC_SIRION_VALE) {
			for (grid.y = y1 - 10; grid.y < y1 + 10; grid.y++) {
				for (grid.x = mid[grid.y] - 10; grid.x < mid[grid.y] + 10;
					 grid.x++) {
					if (distance(centre, grid) < 6) {
						/* ...make Tol-In-Gaurhoth... */
						square_set_feat(c, grid, FEAT_GRASS);
					} else {
						/* ...surround it by water... */
						square_set_feat(c, grid, FEAT_WATER);
					}
					/* ...and build the tower... */
					if (distance(centre, grid) < 2)
						square_set_feat(c, grid, FEAT_GRANITE);
				}
			}
			/* ...with door and stairs */
			square_set_feat(c, loc(mid[y1], y1 + 1), FEAT_CLOSED);
			square_set_feat(c, centre, FEAT_MORE);
			if (level_topography(last_place) == TOP_CAVE) {
				player_place(c, p, centre);
			}
		} else {
			/* Must be Nargothrond */
			/* This place is hard to get into... */
			centre = loc(mid[y1] - 6, y1);
			for (grid.y = y1 - 1; grid.y < y1 + 2; grid.y++) {
				for (grid.x = mid[y1] - 15; grid.x < mid[y1] - 5; grid.x++) {
					if (loc_eq(grid, centre)) {
						square_set_feat(c, grid, FEAT_MORE);
						if (level_topography(last_place) == TOP_CAVE) {
							player_place(c, p, grid);
						}
					} else {
						square_set_feat(c, grid, FEAT_GRANITE);
					}
				}
				for (grid.x = mid[y1] - 5; grid.x < mid[y1]; grid.x++) {
					square_set_feat(c, grid, FEAT_ROAD);
				}
				for (grid.x = mid[y1] - 4; grid.x < mid[y1] + 5; grid.x++) {
					square_set_feat(c, grid, FEAT_WATER);
				}
			}
		}
	}

	/* Place some formations */
	while (form_grids < 50 * c->depth + 1000) {
		/* Choose a place */
		grid.y = randint1(c->height - 2);
		grid.x = randint1(c->width - 2);

		form_grids += make_formation(c, p, grid, FEAT_GRASS, FEAT_GRASS,
									 form_feats, "River", c->depth / 2);
	}

	/* Unmark squares */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_unmark(c, grid);
		}
	}

	/* Move the player out of the river */
	grid = p->grid;
	while ((square_feat(c, grid)->fidx == FEAT_WATER)
		   || (square_feat(c, grid)->fidx == FEAT_GRANITE)) {
		grid.x++;
	}

	/* Place player if they had to move */
	if (!loc_eq(grid, p->grid)) {
		player_place(c, p, grid);
		square_set_feat(c, grid, path);
		for (grid.y = p->grid.y; grid.y > 0; grid.y--) {
			if (!square_ispassable(c, grid)) {
				square_set_feat(c, grid, FEAT_ROAD);
			}
		}
	}

	/* Place objects, traps and monsters */
	(void) populate(c, false);

	mem_free(mid);

	if (!verify_level(c)) {
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "wilderness level had generation issues";
		return NULL;
	}

	return c;
}